

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ql_manager.cc
# Opt level: O0

RC __thiscall QL_Manager::GetAttrCatEntry(QL_Manager *this,RelAttr attr,AttrCatEntry **entry)

{
  int local_38 [2];
  int index;
  RC rc;
  AttrCatEntry **entry_local;
  QL_Manager *this_local;
  RelAttr attr_local;
  
  attr_local.relName = attr.attrName;
  this_local = (QL_Manager *)attr.relName;
  local_38[1] = 0;
  local_38[0] = 0;
  _index = entry;
  entry_local = (AttrCatEntry **)this;
  attr_local.attrName._4_4_ = GetAttrCatEntryPos(this,attr,local_38);
  if (attr_local.attrName._4_4_ == 0) {
    *_index = this->attrEntries + local_38[0];
    attr_local.attrName._4_4_ = 0;
  }
  return attr_local.attrName._4_4_;
}

Assistant:

RC QL_Manager::GetAttrCatEntry(const RelAttr attr, AttrCatEntry *&entry){
  RC rc = 0;
  int index = 0;
  if((rc = GetAttrCatEntryPos(attr, index)))
    return (rc);
  entry = attrEntries + index;
  return (0);
}